

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_verify(secp256k1_fe *a)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uStack_10;
  
  secp256k1_fe_verify_magnitude(a,0x20);
  if (1 < (uint)a->normalized) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_impl.h"
    ;
    pcVar4 = "test condition failed: (a->normalized == 0) || (a->normalized == 1)";
    uStack_10 = 0x99;
    goto LAB_0010d482;
  }
  if (a->normalized == 0) {
LAB_0010d313:
    lVar2 = (long)a->magnitude * 2;
    bVar1 = false;
  }
  else {
    secp256k1_fe_verify_magnitude(a,1);
    if (a->normalized == 0) goto LAB_0010d313;
    lVar2 = 1;
    bVar1 = true;
  }
  uVar5 = lVar2 * 0xfffffffffffff;
  if (uVar5 < a->n[0]) {
    pcVar4 = "test condition failed: d[0] <= 0xFFFFFFFFFFFFFULL * m";
    uStack_10 = 0x16;
  }
  else if (uVar5 < a->n[1]) {
    pcVar4 = "test condition failed: d[1] <= 0xFFFFFFFFFFFFFULL * m";
    uStack_10 = 0x17;
  }
  else if (uVar5 < a->n[2]) {
    pcVar4 = "test condition failed: d[2] <= 0xFFFFFFFFFFFFFULL * m";
    uStack_10 = 0x18;
  }
  else if (uVar5 < a->n[3]) {
    pcVar4 = "test condition failed: d[3] <= 0xFFFFFFFFFFFFFULL * m";
    uStack_10 = 0x19;
  }
  else if ((ulong)(lVar2 * 0xffffffffffff) < a->n[4]) {
    pcVar4 = "test condition failed: d[4] <= 0x0FFFFFFFFFFFFULL * m";
    uStack_10 = 0x1a;
  }
  else {
    if (((!bVar1 || a->n[4] != 0xffffffffffff) || (a->n[0] < 0xffffefffffc2f)) ||
       ((a->n[2] & a->n[1] & a->n[3]) != 0xfffffffffffff)) {
      return;
    }
    pcVar4 = "test condition failed: d[0] < 0xFFFFEFFFFFC2FULL";
    uStack_10 = 0x1d;
  }
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
  ;
LAB_0010d482:
  fprintf(_stderr,"%s:%d: %s\n",pcVar3,uStack_10,pcVar4);
  abort();
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 32);
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}